

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::PathBezierCurveTo(ImDrawList *this,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,int num_segments)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  int iVar4;
  ImVec2 *__src;
  ImVec2 IVar5;
  ImVec2 *__dest;
  int iVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  float x1;
  float y1;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  IVar1 = (this->_Path).Data[(long)(this->_Path).Size + -1];
  x1 = IVar1.x;
  y1 = IVar1.y;
  if (num_segments == 0) {
    PathBezierToCasteljau
              (&this->_Path,x1,y1,p2->x,p2->y,p3->x,p3->y,p4->x,p4->y,
               this->_Data->CurveTessellationTol,0);
  }
  else if (0 < num_segments) {
    iVar7 = 1;
    do {
      fVar13 = (float)iVar7 * (1.0 / (float)num_segments);
      fVar11 = 1.0 - fVar13;
      IVar1 = *p2;
      IVar2 = *p3;
      IVar3 = *p4;
      iVar8 = (this->_Path).Size;
      iVar4 = (this->_Path).Capacity;
      if (iVar8 == iVar4) {
        if (iVar4 == 0) {
          iVar6 = 8;
        }
        else {
          iVar6 = iVar4 / 2 + iVar4;
        }
        iVar8 = iVar8 + 1;
        if (iVar8 < iVar6) {
          iVar8 = iVar6;
        }
        if (iVar4 < iVar8) {
          __dest = (ImVec2 *)ImGui::MemAlloc((long)iVar8 << 3);
          __src = (this->_Path).Data;
          if (__src != (ImVec2 *)0x0) {
            memcpy(__dest,__src,(long)(this->_Path).Size << 3);
            ImGui::MemFree((this->_Path).Data);
          }
          (this->_Path).Data = __dest;
          (this->_Path).Capacity = iVar8;
        }
      }
      fVar10 = fVar11 * fVar11 * fVar11;
      fVar12 = fVar11 * fVar11 * 3.0 * fVar13;
      fVar11 = fVar11 * 3.0 * fVar13 * fVar13;
      fVar13 = fVar13 * fVar13 * fVar13;
      IVar5.y = fVar13 * IVar3.y + fVar11 * IVar2.y + fVar10 * y1 + fVar12 * IVar1.y;
      IVar5.x = fVar13 * IVar3.x + fVar11 * IVar2.x + fVar10 * x1 + fVar12 * IVar1.x;
      (this->_Path).Data[(this->_Path).Size] = IVar5;
      (this->_Path).Size = (this->_Path).Size + 1;
      bVar9 = iVar7 != num_segments;
      iVar7 = iVar7 + 1;
    } while (bVar9);
  }
  return;
}

Assistant:

void ImDrawList::PathBezierCurveTo(const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, int num_segments)
{
    ImVec2 p1 = _Path.back();
    if (num_segments == 0)
    {
        // Auto-tessellated
        PathBezierToCasteljau(&_Path, p1.x, p1.y, p2.x, p2.y, p3.x, p3.y, p4.x, p4.y, _Data->CurveTessellationTol, 0);
    }
    else
    {
        float t_step = 1.0f / (float)num_segments;
        for (int i_step = 1; i_step <= num_segments; i_step++)
        {
            float t = t_step * i_step;
            float u = 1.0f - t;
            float w1 = u*u*u;
            float w2 = 3*u*u*t;
            float w3 = 3*u*t*t;
            float w4 = t*t*t;
            _Path.push_back(ImVec2(w1*p1.x + w2*p2.x + w3*p3.x + w4*p4.x, w1*p1.y + w2*p2.y + w3*p3.y + w4*p4.y));
        }
    }
}